

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_inter_mode(aom_writer *w,PREDICTION_MODE mode,FRAME_CONTEXT *ec_ctx,int16_t mode_ctx)

{
  ushort uVar1;
  ushort uVar2;
  ushort in_CX;
  undefined8 in_RDX;
  char in_SIL;
  int16_t refmv_ctx;
  int16_t zeromv_ctx;
  int16_t newmv_ctx;
  int in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe2;
  int symb;
  undefined7 in_stack_fffffffffffffff0;
  
  symb = (int)((ulong)in_RDX >> 0x20);
  uVar1 = in_CX & 7;
  aom_write_symbol((aom_writer *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),symb,
                   (aom_cdf_prob *)
                   (CONCAT26(in_CX,CONCAT24(in_CX,CONCAT22(in_stack_ffffffffffffffe2,
                                                           in_stack_ffffffffffffffe0))) &
                   0xffff0007ffffffff),in_stack_ffffffffffffffdc);
  if (in_SIL != '\x10') {
    uVar2 = (short)in_CX >> 3 & 1;
    aom_write_symbol((aom_writer *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),symb,
                     (aom_cdf_prob *)
                     (CONCAT26(in_CX,CONCAT24(uVar1,CONCAT22((short)in_CX >> 3,
                                                             in_stack_ffffffffffffffe0))) &
                     0xffffffff0001ffff),in_stack_ffffffffffffffdc);
    if (in_SIL != '\x0f') {
      aom_write_symbol((aom_writer *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),symb,
                       (aom_cdf_prob *)
                       (CONCAT26(in_CX,CONCAT24(uVar1,CONCAT22(uVar2,(short)in_CX >> 4))) &
                       0xffffffffffff000f),in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

static inline void write_inter_mode(aom_writer *w, PREDICTION_MODE mode,
                                    FRAME_CONTEXT *ec_ctx,
                                    const int16_t mode_ctx) {
  const int16_t newmv_ctx = mode_ctx & NEWMV_CTX_MASK;

  aom_write_symbol(w, mode != NEWMV, ec_ctx->newmv_cdf[newmv_ctx], 2);

  if (mode != NEWMV) {
    const int16_t zeromv_ctx =
        (mode_ctx >> GLOBALMV_OFFSET) & GLOBALMV_CTX_MASK;
    aom_write_symbol(w, mode != GLOBALMV, ec_ctx->zeromv_cdf[zeromv_ctx], 2);

    if (mode != GLOBALMV) {
      int16_t refmv_ctx = (mode_ctx >> REFMV_OFFSET) & REFMV_CTX_MASK;
      aom_write_symbol(w, mode != NEARESTMV, ec_ctx->refmv_cdf[refmv_ctx], 2);
    }
  }
}